

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O0

size_t __thiscall websocketpp::http::parser::response::consume(response *this,char *buf,size_t len)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last1;
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  difference_type dVar4;
  undefined8 uVar5;
  long lVar6;
  exception *this_00;
  ulong uVar7;
  string *log_msg;
  string *body;
  size_t sVar8;
  size_t in_RDX;
  ulong in_RSI;
  response *in_RDI;
  iterator unaff_retaddr;
  size_t read;
  istringstream ss;
  string length;
  iterator end;
  iterator begin;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffba0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffba8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbb8;
  string *error_msg;
  undefined4 in_stack_fffffffffffffbc0;
  value in_stack_fffffffffffffbc4;
  value error_code;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbc8;
  exception *in_stack_fffffffffffffbd0;
  size_t local_3a0;
  string local_390 [32];
  string local_370 [39];
  undefined1 local_349 [33];
  istringstream local_328 [56];
  parser *in_stack_fffffffffffffd10;
  iterator in_stack_fffffffffffffd18;
  iterator in_stack_fffffffffffffd20;
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [39];
  undefined1 local_159;
  string local_158 [32];
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  char *local_f0;
  undefined8 local_e8;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  undefined1 local_c1;
  string local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  undefined8 local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  size_t local_20;
  ulong local_18;
  response *this_01;
  iterator in_stack_fffffffffffffff8;
  
  if (in_RDI->m_state == DONE) {
    local_3a0 = 0;
  }
  else if (in_RDI->m_state == BODY) {
    local_3a0 = process_body((response *)in_stack_fffffffffffffba8._M_current,
                             (char *)in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    this_01 = in_RDI;
    peVar3 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x30ef18);
    std::__cxx11::string::append((char *)peVar3,local_18);
    std::
    __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x30ef44);
    local_30 = (char *)std::__cxx11::string::begin();
    local_28 = local_30;
    while( true ) {
      local_40 = local_28;
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30ef88);
      local_48 = std::__cxx11::string::end();
      __last1._M_current._4_4_ = in_stack_fffffffffffffbc4;
      __last1._M_current._0_4_ = in_stack_fffffffffffffbc0;
      local_38 = (char *)std::
                         search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*>
                                   (in_stack_fffffffffffffbc8,__last1,
                                    in_stack_fffffffffffffbb8._M_current,
                                    in_stack_fffffffffffffbb0._M_current);
      local_30 = local_38;
      dVar4 = __gnu_cxx::operator-(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      (in_RDI->super_parser).m_header_bytes = dVar4 + 3 + (in_RDI->super_parser).m_header_bytes;
      if (16000 < (in_RDI->super_parser).m_header_bytes) {
        local_c1 = 1;
        uVar5 = __cxa_allocate_exception(0x70);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"Maximum header size exceeded.",&local_69);
        std::__cxx11::string::string(local_a0);
        std::__cxx11::string::string(local_c0);
        exception::exception
                  (in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8._M_current,
                   in_stack_fffffffffffffbc4,(string *)in_stack_fffffffffffffbb8._M_current,
                   (string *)in_stack_fffffffffffffbb0._M_current);
        local_c1 = 0;
        __cxa_throw(uVar5,&exception::typeinfo,exception::~exception);
      }
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30f16c);
      local_d0 = std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator==(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      if (bVar1) {
        local_d8 = local_28;
        local_e0 = local_30;
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x30f1ce);
        local_e8 = std::__cxx11::string::begin();
        local_f0 = (char *)std::
                           copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                     (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                                      in_stack_fffffffffffffba8);
        peVar3 = std::
                 __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x30f217);
        __gnu_cxx::operator-(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        std::__cxx11::string::resize((ulong)peVar3);
        in_RDI->m_read = local_20 + in_RDI->m_read;
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x30f268);
        lVar6 = std::__cxx11::string::size();
        (in_RDI->super_parser).m_header_bytes = (in_RDI->super_parser).m_header_bytes - lVar6;
        return local_20;
      }
      dVar4 = __gnu_cxx::operator-(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      if (dVar4 == 0) break;
      if (in_RDI->m_state == RESPONSE_LINE) {
        process(this_01,unaff_retaddr,in_stack_fffffffffffffff8);
        in_RDI->m_state = HEADERS;
      }
      else {
        parser::process_header
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      }
      local_28 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(in_stack_fffffffffffffb98,
                                     (difference_type)in_stack_fffffffffffffb90);
    }
    if (in_RDI->m_state == RESPONSE_LINE) {
      local_159 = 1;
      uVar5 = __cxa_allocate_exception(0x70);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"Incomplete Request",&local_111);
      std::__cxx11::string::string(local_138);
      std::__cxx11::string::string(local_158);
      exception::exception
                (in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8._M_current,
                 in_stack_fffffffffffffbc4,(string *)in_stack_fffffffffffffbb8._M_current,
                 (string *)in_stack_fffffffffffffbb0._M_current);
      local_159 = 0;
      __cxa_throw(uVar5,&exception::typeinfo,exception::~exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"Content-Length",&local_1a1);
    this_00 = (exception *)
              parser::get_header((parser *)in_stack_fffffffffffffba8._M_current,
                                 in_stack_fffffffffffffba0);
    std::__cxx11::string::string(local_180,(string *)this_00);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::istringstream::istringstream(local_328,local_180,8);
      log_msg = (string *)std::istream::operator>>(local_328,&in_RDI->m_read);
      bVar2 = std::ios::fail();
      error_code = CONCAT13(bVar2,(int3)in_stack_fffffffffffffbc4);
      if ((bVar2 & 1) != 0) {
        body = (string *)__cxa_allocate_exception(0x70);
        error_msg = (string *)local_349;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_349 + 1),"Unable to parse Content-Length header",
                   (allocator *)error_msg);
        std::__cxx11::string::string(local_370);
        std::__cxx11::string::string(local_390);
        exception::exception(this_00,log_msg,error_code,error_msg,body);
        __cxa_throw(body,&exception::typeinfo,exception::~exception);
      }
      std::__cxx11::istringstream::~istringstream(local_328);
    }
    else {
      in_RDI->m_read = 0;
    }
    in_RDI->m_state = BODY;
    sVar8 = local_20;
    std::
    __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x30f6ed);
    std::__cxx11::string::end();
    dVar4 = __gnu_cxx::operator-(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    local_3a0 = (sVar8 - dVar4) + 2;
    if (local_3a0 < local_20) {
      sVar8 = process_body((response *)in_stack_fffffffffffffba8._M_current,
                           (char *)in_stack_fffffffffffffba0,sVar8);
      local_3a0 = sVar8 + local_3a0;
    }
    std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::reset((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)in_stack_fffffffffffffba0);
    std::__cxx11::string::~string(local_180);
  }
  return local_3a0;
}

Assistant:

inline size_t response::consume(char const * buf, size_t len) {
    if (m_state == DONE) {return 0;}

    if (m_state == BODY) {
        return this->process_body(buf,len);
    }

    // copy new header bytes into buffer
    m_buf->append(buf,len);

    // Search for delimiter in buf. If found read until then. If not read all
    std::string::iterator begin = m_buf->begin();
    std::string::iterator end = begin;


    for (;;) {
        // search for delimiter
        end = std::search(
            begin,
            m_buf->end(),
            header_delimiter,
            header_delimiter + sizeof(header_delimiter) - 1
        );

        m_header_bytes += (end-begin+sizeof(header_delimiter));
        
        if (m_header_bytes > max_header_size) {
            // exceeded max header size
            throw exception("Maximum header size exceeded.",
                status_code::request_header_fields_too_large);
        }

        if (end == m_buf->end()) {
            // we are out of bytes. Discard the processed bytes and copy the
            // remaining unprecessed bytes to the beginning of the buffer
            std::copy(begin,end,m_buf->begin());
            m_buf->resize(static_cast<std::string::size_type>(end-begin));

            m_read += len;
            m_header_bytes -= m_buf->size();

            return len;
        }

        //the range [begin,end) now represents a line to be processed.

        if (end-begin == 0) {
            // we got a blank line
            if (m_state == RESPONSE_LINE) {
                throw exception("Incomplete Request",status_code::bad_request);
            }

            // TODO: grab content-length
            std::string length = get_header("Content-Length");

            if (length.empty()) {
                // no content length found, read indefinitely
                m_read = 0;
            } else {
                std::istringstream ss(length);

                if ((ss >> m_read).fail()) {
                    throw exception("Unable to parse Content-Length header",
                                    status_code::bad_request);
                }
            }

            m_state = BODY;

            // calc header bytes processed (starting bytes - bytes left)
            size_t read = (
                len - static_cast<std::string::size_type>(m_buf->end() - end)
                + sizeof(header_delimiter) - 1
            );

            // if there were bytes left process them as body bytes
            if (read < len) {
                read += this->process_body(buf+read,(len-read));
            }

            // frees memory used temporarily during header parsing
            m_buf.reset();

            return read;
        } else {
            if (m_state == RESPONSE_LINE) {
                this->process(begin,end);
                m_state = HEADERS;
            } else {
                this->process_header(begin,end);
            }
        }

        begin = end+(sizeof(header_delimiter) - 1);
    }
}